

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O1

void output(vector<double,_std::allocator<double>_> *Ea,vector<double,_std::allocator<double>_> *ca,
           int simulations,double E_exact,double c_exact)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  char local_5b [11];
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  double local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  lVar7 = (long)simulations;
  pdVar2 = (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar2[lVar7] = 0.0;
  pdVar3 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar3[lVar7] = 0.0;
  pdVar2[lVar7 + 1] = 0.0;
  pdVar3[lVar7 + 1] = 0.0;
  dVar9 = (double)simulations;
  uVar8 = (ulong)(uint)simulations;
  if (0 < simulations) {
    uVar6 = 0;
    do {
      pdVar2[lVar7] = pdVar2[uVar6] / dVar9 + pdVar2[lVar7];
      pdVar3[lVar7] = pdVar3[uVar6] / dVar9 + pdVar3[lVar7];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  lVar1 = lVar7 + 1;
  if (0 < simulations) {
    uVar6 = 0;
    do {
      pdVar2[lVar1] =
           (pdVar2[uVar6] - pdVar2[lVar7]) * (pdVar2[uVar6] - pdVar2[lVar7]) + pdVar2[lVar1];
      pdVar3[lVar1] =
           (pdVar3[uVar6] - pdVar3[lVar7]) * (pdVar3[uVar6] - pdVar3[lVar7]) + pdVar3[lVar1];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  pvVar10 = (vector<double,_std::allocator<double>_> *)((dVar9 + -1.0) * dVar9);
  dVar9 = pdVar2[lVar1] / (double)pvVar10;
  pdVar2[lVar1] = dVar9;
  local_48 = E_exact;
  local_40 = c_exact;
  if (dVar9 < 0.0) {
    local_50 = pvVar10;
    dVar9 = sqrt(dVar9);
    pvVar10 = local_50;
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar9;
  pdVar2 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar9 = pdVar2[lVar1] / (double)pvVar10;
  pdVar2[lVar1] = dVar9;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar9;
  local_38 = Ea;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\t E\t\t c\n",9);
  local_50 = ca;
  if (0 < simulations) {
    uVar6 = 0;
    do {
      local_5b[0] = '\t';
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5b,1);
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
      poVar5 = std::ostream::_M_insert<double>
                         ((local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      local_5b[1] = 9;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 1,1);
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
      poVar5 = std::ostream::_M_insert<double>
                         ((local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      local_5b[2] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 2,1);
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t--------------\t--------------",0x1e);
  local_5b[3] = 10;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_5b + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"mean\t",5);
  pvVar4 = local_38;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7]);
  local_5b[4] = 9;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 4,1);
  pvVar10 = local_50;
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7]);
  local_5b[5] = 10;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Del\t",4);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7] - local_48);
  local_5b[6] = 9;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 6,1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7] - local_40);
  local_5b[7] = 10;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 7,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"sig\t",4);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar1]);
  local_5b[8] = 9;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 8,1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  poVar5 = std::ostream::_M_insert<double>
                     ((pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar1]);
  local_5b[9] = 10;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Del/sig\t",8);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  pdVar2 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  poVar5 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar7] - local_48) / pdVar2[lVar1]);
  local_5b[10] = 9;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_5b + 10,1);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 8) = 8;
  pdVar2 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  poVar5 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar7] - local_40) / pdVar2[lVar1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void output(std::vector<double> &Ea, std::vector<double> &ca, int simulations, double E_exact,
            double c_exact) {
  Ea[simulations] = 0.0;
  ca[simulations] = 0.0;
  Ea[simulations + 1] = 0.0;
  ca[simulations + 1] = 0.0;
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations] += Ea[j] / simulations;
    ca[simulations] += ca[j] / simulations;
  }
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations + 1] += (Ea[j] - Ea[simulations]) * (Ea[j] - Ea[simulations]);
    ca[simulations + 1] += (ca[j] - ca[simulations]) * (ca[j] - ca[simulations]);
  }
  Ea[simulations + 1] /= (simulations - 1.0) * simulations;
  Ea[simulations + 1] = std::sqrt(Ea[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  ca[simulations + 1] /= (simulations - 1.0) * simulations;
  ca[simulations + 1] = std::sqrt(ca[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  std::cout << "\n\t E\t\t c\n";
  for (int j{0}; j < simulations; ++j)
    std::cout << '\t' << std::setprecision(8) << Ea[j] << '\t' << std::setprecision(8) << ca[j]
              << '\n';
  std::cout << "\t--------------\t--------------" << '\n'
            << "mean\t" << std::setprecision(8) << Ea[simulations] << '\t'
            << std::setprecision(8) << ca[simulations] << '\n'
            << "Del\t" << std::setprecision(8) << Ea[simulations] - E_exact << '\t'
            << std::setprecision(8) << ca[simulations] - c_exact << '\n'
            << "sig\t" << std::setprecision(8) << Ea[simulations + 1] << '\t'
            << std::setprecision(8) << ca[simulations + 1] << '\n'
            << "Del/sig\t" << std::setprecision(8)
            << std::abs(Ea[simulations] - E_exact) / Ea[simulations + 1] << '\t'
            << std::setprecision(8) << std::abs(ca[simulations] - c_exact) / ca[simulations + 1]
            << std::endl;
}